

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrImpl.cpp
# Opt level: O2

void __thiscall xercesc_4_0::DOMAttrImpl::release(DOMAttrImpl *this)

{
  ushort uVar1;
  DOMDocument *pDVar2;
  int iVar3;
  DOMException *this_00;
  undefined4 extraout_var;
  undefined8 *puVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  uVar1 = (this->fNode).flags;
  if (((uVar1 & 8) == 0) || ((uVar1 & 0x1000) != 0)) {
    pDVar2 = (this->fParent).fOwnerDocument;
    if (pDVar2 != (DOMDocument *)0x0) {
      DOMNodeImpl::callUserDataHandlers(&this->fNode,NODE_DELETED,(DOMNode *)0x0,(DOMNode *)0x0);
      DOMParentNode::release(&this->fParent);
      (*pDVar2[-1].super_DOMNode._vptr_DOMNode[6])(&pDVar2[-1].super_DOMNode,this,0);
      return;
    }
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    iVar3 = (*(this->super_DOMAttr).super_DOMNode._vptr_DOMNode[0xc])(this);
    if (CONCAT44(extraout_var,iVar3) == 0) {
      puVar4 = &XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar3 = (*(this->super_DOMAttr).super_DOMNode._vptr_DOMNode[0xc])(this);
      puVar4 = (undefined8 *)(CONCAT44(extraout_var_01,iVar3) + 0x158);
    }
    DOMException::DOMException(this_00,0xf,0,(MemoryManager *)*puVar4);
  }
  else {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    iVar3 = (*(this->super_DOMAttr).super_DOMNode._vptr_DOMNode[0xc])(this);
    if (CONCAT44(extraout_var_00,iVar3) == 0) {
      puVar4 = &XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar3 = (*(this->super_DOMAttr).super_DOMNode._vptr_DOMNode[0xc])(this);
      puVar4 = (undefined8 *)(CONCAT44(extraout_var_02,iVar3) + 0x158);
    }
    DOMException::DOMException(this_00,0xf,0,(MemoryManager *)*puVar4);
  }
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

void DOMAttrImpl::release()
{
    if (fNode.isOwned() && !fNode.isToBeReleased())
        throw DOMException(DOMException::INVALID_ACCESS_ERR,0, GetDOMNodeMemoryManager);

    DOMDocumentImpl* doc = (DOMDocumentImpl*)fParent.fOwnerDocument;
    if (doc) {
        fNode.callUserDataHandlers(DOMUserDataHandler::NODE_DELETED, 0, 0);
        fParent.release();
        doc->release(this, DOMMemoryManager::ATTR_OBJECT);
    }
    else {
        // shouldn't reach here
        throw DOMException(DOMException::INVALID_ACCESS_ERR,0, GetDOMNodeMemoryManager);
    }
}